

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O3

Msat_Clause_t * Msat_SolverPropagate(Msat_Solver_t *p)

{
  ABC_INT64_T *pAVar1;
  long lVar2;
  Msat_ClauseVec_t **ppMVar3;
  Msat_Clause_t *pMVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Msat_Clause_t **ppMVar8;
  long lVar9;
  int nSizeNew;
  long lVar10;
  ulong uVar11;
  Msat_Lit_t Lit_out;
  uint local_4c;
  Msat_Clause_t **local_48;
  Msat_ClauseVec_t **local_40;
  ulong local_38;
  
  ppMVar3 = p->pvWatched;
  uVar5 = Msat_QueueExtract(p->pQueue);
  local_40 = ppMVar3;
  do {
    if ((int)uVar5 < 0) {
      return (Msat_Clause_t *)0x0;
    }
    pAVar1 = &(p->Stats).nPropagations;
    *pAVar1 = *pAVar1 + 1;
    uVar11 = (ulong)uVar5;
    uVar5 = Msat_ClauseVecReadSize(ppMVar3[uVar11]);
    local_38 = uVar11;
    ppMVar8 = Msat_ClauseVecReadArray(ppMVar3[uVar11]);
    nSizeNew = 0;
    local_48 = ppMVar8;
    if (0 < (int)uVar5) {
      lVar10 = 0;
      nSizeNew = 0;
      do {
        pAVar1 = &(p->Stats).nInspects;
        *pAVar1 = *pAVar1 + 1;
        local_4c = 0xffffffff;
        iVar6 = Msat_ClausePropagate
                          (*ppMVar8,(Msat_Lit_t)local_38,p->pAssigns,(Msat_Lit_t *)&local_4c);
        if (iVar6 == 0) {
          iVar6 = Msat_SolverEnqueue(p,local_4c,*ppMVar8);
          if (iVar6 == 0) {
            uVar7 = -(int)lVar10;
            pMVar4 = *ppMVar8;
            if (uVar5 != uVar7 && SBORROW4(uVar5,uVar7) == (int)(uVar5 + (int)lVar10) < 0) {
              lVar9 = 0;
              do {
                local_48[nSizeNew + lVar9] = *ppMVar8;
                ppMVar8 = ppMVar8 + 1;
                lVar2 = lVar9 - (ulong)uVar5;
                lVar9 = lVar9 + 1;
              } while (lVar2 + 1 != lVar10);
              nSizeNew = nSizeNew + (int)lVar9;
            }
            Msat_ClauseVecShrink(local_40[local_38],nSizeNew);
            Msat_QueueClear(p->pQueue);
            return pMVar4;
          }
LAB_008fad22:
          lVar9 = (long)nSizeNew;
          nSizeNew = nSizeNew + 1;
          local_48[lVar9] = *ppMVar8;
        }
        else {
          if ((int)local_4c < 0) goto LAB_008fad22;
          Msat_ClauseVecPush(local_40[local_4c],*ppMVar8);
        }
        ppMVar8 = ppMVar8 + 1;
        lVar10 = lVar10 + -1;
      } while (-lVar10 != (ulong)uVar5);
    }
    ppMVar3 = local_40;
    Msat_ClauseVecShrink(local_40[local_38],nSizeNew);
    uVar5 = Msat_QueueExtract(p->pQueue);
  } while( true );
}

Assistant:

Msat_Clause_t * Msat_SolverPropagate( Msat_Solver_t * p )
{
    Msat_ClauseVec_t ** pvWatched = p->pvWatched;
    Msat_Clause_t ** pClauses;
    Msat_Clause_t * pConflict;
    Msat_Lit_t Lit, Lit_out;
    int i, j, nClauses;

    // propagate all the literals in the queue
    while ( (Lit = Msat_QueueExtract( p->pQueue )) >= 0 )
    {
        p->Stats.nPropagations++;
        // get the clauses watched by this literal
        nClauses = Msat_ClauseVecReadSize( pvWatched[Lit] );
        pClauses = Msat_ClauseVecReadArray( pvWatched[Lit] );
        // go through the watched clauses and decide what to do with them
        for ( i = j = 0; i < nClauses; i++ )
        {
            p->Stats.nInspects++;
            // clear the returned literal
            Lit_out = -1;
            // propagate the clause
            if ( !Msat_ClausePropagate( pClauses[i], Lit, p->pAssigns, &Lit_out ) )
            {   // the clause is unit
                // "Lit_out" contains the new assignment to be enqueued
                if ( Msat_SolverEnqueue( p, Lit_out, pClauses[i] ) ) 
                { // consistent assignment 
                    // no changes to the implication queue; the watch is the same too
                    pClauses[j++] = pClauses[i];
                    continue;
                }
                // remember the reason of conflict (will be returned)
                pConflict = pClauses[i];
                // leave the remaning clauses in the same watched list
                for ( ; i < nClauses; i++ )
                    pClauses[j++] = pClauses[i];
                Msat_ClauseVecShrink( pvWatched[Lit], j );
                // clear the propagation queue
                Msat_QueueClear( p->pQueue );
                return pConflict;
            }
            // the clause is not unit
            // in this case "Lit_out" contains the new watch if it has changed
            if ( Lit_out >= 0 )
                Msat_ClauseVecPush( pvWatched[Lit_out], pClauses[i] );
            else // the watch did not change
                pClauses[j++] = pClauses[i];
        }
        Msat_ClauseVecShrink( pvWatched[Lit], j );
    }
    return NULL;
}